

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O1

bool dxil_spv::emit_create_handle
               (Impl *impl,CallInst *instruction,ResourceType resource_type,uint resource_range,
               Value *instruction_offset,bool non_uniform)

{
  mapped_type mVar1;
  uint64_t uVar2;
  pointer pRVar3;
  char *pcVar4;
  DescriptorQATypeFlagBits DVar5;
  ComponentType CVar6;
  undefined2 uVar7;
  RawVecSize RVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  uint8_t uVar17;
  undefined3 uVar18;
  StorageClass SVar19;
  bool bVar20;
  uint32_t uVar21;
  Id IVar22;
  Id IVar23;
  Id IVar24;
  StorageClass SVar25;
  Dim DVar26;
  Builder *pBVar27;
  pointer pLVar28;
  mapped_type *pmVar29;
  mapped_type *pmVar30;
  mapped_type *pmVar31;
  mapped_type *pmVar32;
  LoggingCallback p_Var33;
  void *pvVar34;
  Builder *this;
  Operation *pOVar35;
  Operation *this_00;
  undefined8 uVar36;
  size_type sVar37;
  ResourceReference *pRVar38;
  undefined4 uVar39;
  Value *dynamic_offset;
  CallInst *pCVar40;
  undefined7 in_register_00000011;
  CallInst *pCVar41;
  long lVar42;
  undefined7 in_register_00000089;
  undefined4 uVar43;
  pointer pRVar44;
  char *pcVar45;
  char cVar46;
  bool is_non_uniform_3;
  Id loaded_id;
  Id resource_id_1;
  Id resource_id;
  CallInst *local_10a8;
  CallInst *local_10a0;
  undefined4 local_1098;
  DescriptorQATypeFlagBits local_1094;
  byte local_108d;
  bool is_non_uniform;
  Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
  ResourceMetaInstrumentation instrumentation;
  Id ptr_id;
  RawWidth RStack_1034;
  undefined8 uStack_1030;
  char acStack_1028 [9];
  undefined4 local_101f;
  undefined4 uStack_101b;
  undefined4 uStack_1017;
  undefined4 uStack_1013;
  
  uVar43 = (undefined4)CONCAT71(in_register_00000089,non_uniform);
  pBVar27 = Converter::Impl::builder(impl);
  local_10a8 = instruction;
  local_1094 = resource_range;
  switch(CONCAT71(in_register_00000011,resource_type) & 0xffffffff) {
  case 0:
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar30->reference;
    }
    else {
      pRVar38 = (impl->srv_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    if (pRVar38->resource_kind == RTAccelerationStructure) {
      this = Converter::Impl::builder(impl);
      SVar25 = spv::Builder::getStorageClass(this,pRVar38->var_id);
      if (SVar25 == StorageClassStorageBuffer) {
LAB_0016117a:
        pBVar27 = Converter::Impl::builder(impl);
        SVar25 = spv::Builder::getStorageClass(pBVar27,pRVar38->var_id);
        if (SVar25 == StorageClassStorageBuffer) {
          dynamic_offset = (Value *)0x0;
          if (pRVar38->base_resource_is_array != false) {
            dynamic_offset = instruction_offset;
          }
          IVar22 = build_bindless_heap_offset(impl,pRVar38,0x140,dynamic_offset);
          if (!non_uniform) {
            _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x40);
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                        *)&pBVar27->capabilities,&ptr_id);
            IVar23 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
            pOVar35 = Converter::Impl::allocate(impl,OpGroupNonUniformBroadcastFirst,IVar23);
            IVar23 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
            IVar23 = spv::Builder::makeIntConstant(pBVar27,IVar23,3,false);
            Operation::add_id(pOVar35,IVar23);
            Operation::add_id(pOVar35,IVar22);
            Converter::Impl::add(impl,pOVar35,false);
            IVar22 = pOVar35->id;
          }
          IVar22 = build_physical_address_indexing_from_ssbo(impl,IVar22);
          IVar23 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
          IVar23 = spv::Builder::makeVectorType(pBVar27,IVar23,2);
          IVar24 = spv::Builder::makePointer(pBVar27,StorageClassStorageBuffer,IVar23);
          pOVar35 = Converter::Impl::allocate(impl,OpAccessChain,IVar24);
          Operation::add_id(pOVar35,pRVar38->var_id);
          IVar24 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
          IVar24 = spv::Builder::makeIntConstant(pBVar27,IVar24,0,false);
          Operation::add_id(pOVar35,IVar24);
          Operation::add_id(pOVar35,IVar22);
          Converter::Impl::add(impl,pOVar35,false);
          this_00 = Converter::Impl::allocate(impl,OpLoad,IVar23);
          Operation::add_id(this_00,pOVar35->id);
          Converter::Impl::add(impl,this_00,false);
          IVar22 = this_00->id;
        }
        else {
          IVar22 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
        }
        IVar23 = spv::Builder::makeAccelerationStructureType(pBVar27);
        pOVar35 = Converter::Impl::allocate(impl,OpConvertUToAccelerationStructureKHR,IVar23);
        Operation::add_id(pOVar35,IVar22);
        Converter::Impl::add(impl,pOVar35,false);
        _ptr_id = (CallInst *)CONCAT44(RStack_1034,pOVar35->id);
        Converter::Impl::rewrite_value(impl,(Value *)local_10a8,pOVar35->id);
        pmVar31 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_resource_meta,&ptr_id);
        pmVar31->kind = Invalid;
        pmVar31->component_type = Invalid;
        pmVar31->raw_component_vecsize = V1;
        pmVar31->stride = 0;
        pmVar31->var_id = 0;
        pRVar44 = (pmVar31->var_alias_group).
                  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (pmVar31->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pmVar31->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pmVar31->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pRVar44 != (pointer)0x0) {
          free_in_thread(pRVar44);
        }
        pmVar31->aliased = false;
        pmVar31->non_uniform = false;
        pmVar31->counter_is_physical_pointer = false;
        pmVar31->rov = false;
        pmVar31->storage = StorageClassUniformConstant;
        pmVar31->counter_var_id = 0;
        (pmVar31->physical_pointer_meta).nonwritable = false;
        (pmVar31->physical_pointer_meta).nonreadable = false;
        (pmVar31->physical_pointer_meta).coherent = false;
        (pmVar31->physical_pointer_meta).rov = false;
        (pmVar31->physical_pointer_meta).stride = '\0';
        *(undefined8 *)&(pmVar31->physical_pointer_meta).size = 0;
        (pmVar31->instrumentation).bda_id = 0;
        (pmVar31->instrumentation).elem_size_id = 0;
        (pmVar31->instrumentation).resource_size_id = 0;
        pmVar31->storage = StorageClassGeneric;
        pmVar31->kind = RTAccelerationStructure;
        return true;
      }
      if ((long)pRVar38->local_root_signature_entry < 0) {
        cVar46 = pRVar38->root_descriptor;
      }
      else {
        cVar46 = (impl->local_root_signature).
                 super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start[pRVar38->local_root_signature_entry].type
                 == Descriptor;
      }
      if (cVar46 != '\0') goto LAB_0016117a;
    }
    if ((long)pRVar38->local_root_signature_entry < 0) {
      cVar46 = pRVar38->root_descriptor;
    }
    else {
      cVar46 = (impl->local_root_signature).
               super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[pRVar38->local_root_signature_entry].type
               == Descriptor;
    }
    if (cVar46 != '\0') {
      IVar22 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar22);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar22);
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      pmVar31->kind = Invalid;
      pmVar31->component_type = Invalid;
      pmVar31->raw_component_vecsize = V1;
      pmVar31->stride = 0;
      pmVar31->var_id = 0;
      pRVar44 = (pmVar31->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar44 != (pointer)0x0) {
        free_in_thread(pRVar44);
      }
      pmVar31->aliased = false;
      pmVar31->non_uniform = false;
      pmVar31->counter_is_physical_pointer = false;
      pmVar31->rov = false;
      pmVar31->storage = StorageClassUniformConstant;
      pmVar31->counter_var_id = 0;
      (pmVar31->physical_pointer_meta).nonwritable = false;
      (pmVar31->physical_pointer_meta).nonreadable = false;
      (pmVar31->physical_pointer_meta).coherent = false;
      (pmVar31->physical_pointer_meta).rov = false;
      (pmVar31->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar31->physical_pointer_meta).size = 0;
      (pmVar31->instrumentation).bda_id = 0;
      (pmVar31->instrumentation).elem_size_id = 0;
      (pmVar31->instrumentation).resource_size_id = 0;
      pmVar31->stride = pRVar38->stride;
      pmVar31->storage = StorageClassPhysicalStorageBuffer;
      (pmVar31->physical_pointer_meta).nonwritable = true;
      pmVar31->kind = pRVar38->resource_kind;
      return true;
    }
    _is_non_uniform = _is_non_uniform & 0xffffff00;
    IVar22 = pRVar38->var_id;
    if (IVar22 == 0) {
      pRVar44 = (pRVar38->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar44 ==
          (pRVar38->var_alias_group).
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        IVar22 = 0;
      }
      else {
        IVar22 = pRVar44->var_id;
      }
    }
    SVar25 = get_resource_storage_class(impl,IVar22);
    local_10a0 = (CallInst *)CONCAT44(local_10a0._4_4_,8);
    if (SVar25 != StorageClassStorageBuffer) {
      local_10a0 = (CallInst *)CONCAT44(local_10a0._4_4_,0x10);
      if (3 < (byte)(pRVar38->resource_kind - TypedBuffer)) {
        uVar39 = 1;
        if (pRVar38->resource_kind == RTAccelerationStructure) {
          uVar39 = 0x40;
        }
        local_10a0 = (CallInst *)CONCAT44(local_10a0._4_4_,uVar39);
      }
    }
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    resource_id = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve(&raw_declarations,
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar22 = pRVar38->var_id;
    if (IVar22 != 0) {
      resource_id = IVar22;
      bVar20 = build_load_resource_handle
                         (impl,IVar22,pRVar38,(DescriptorQATypeFlagBits)local_10a0,local_10a8,
                          instruction_offset,non_uniform,&is_non_uniform,(Id *)0x0,&loaded_id,
                          &resource_id_1,&instrumentation);
      if (!bVar20) {
        p_Var33 = get_thread_log_callback();
        if (p_Var33 == (LoggingCallback)0x0) {
          emit_create_handle();
        }
        else {
          builtin_strncpy(acStack_1028,"RV resou",8);
          uStack_1030._4_1_ = 'a';
          uStack_1030._5_1_ = 'd';
          uStack_1030._6_1_ = ' ';
          uStack_1030._7_1_ = 'S';
LAB_00161ccd:
          local_101f = 0x68206563;
          acStack_1028[8] = 0x72;
          uStack_1030._0_4_ = 0x6f6c206f;
          uVar36 = 0xa2e656c646e61;
LAB_00161cdb:
          _ptr_id = (CallInst *)0x742064656c696146;
          uStack_101b = (undefined4)uVar36;
          uStack_1017 = (undefined4)((ulong)uVar36 >> 0x20);
          pvVar34 = get_thread_log_callback_userdata();
          (*p_Var33)(pvVar34,Error,(char *)&ptr_id);
        }
        goto LAB_00161cf1;
      }
    }
    pRVar3 = (pRVar38->var_alias_group).
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1098 = uVar43;
    pCVar41 = local_10a8;
    for (pRVar44 = (pRVar38->var_alias_group).
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ._M_impl.super__Vector_impl_data._M_start; pRVar44 != pRVar3;
        pRVar44 = pRVar44 + 1) {
      resource_id = pRVar44->var_id;
      bVar20 = build_load_resource_handle
                         (impl,resource_id,pRVar38,(DescriptorQATypeFlagBits)local_10a0,pCVar41,
                          instruction_offset,non_uniform,&is_non_uniform,(Id *)0x0,&loaded_id,
                          &resource_id_1,&instrumentation);
      if (bVar20) {
        _ptr_id = *(CallInst **)&pRVar44->declaration;
        uStack_1030._4_4_ = loaded_id;
        uStack_1030._0_4_ = (pRVar44->declaration).vecsize;
        if (raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                    (&raw_declarations,
                     (iterator)
                     raw_declarations.
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(RawDeclarationVariable *)&ptr_id);
        }
        else {
          *(CallInst **)
           &(raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish)->declaration = _ptr_id;
          *(undefined8 *)
           &((raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_finish)->declaration).vecsize = uStack_1030;
          raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        p_Var33 = get_thread_log_callback();
        if (p_Var33 == (LoggingCallback)0x0) {
          emit_create_handle();
          pCVar41 = local_10a8;
        }
        else {
          builtin_strncpy(acStack_1028,"RV resour",9);
          local_101f = 0x68206563;
          _ptr_id = (CallInst *)0x742064656c696146;
          uStack_1030 = 0x532064616f6c206f;
          uStack_101b = 0x6c646e61;
          uStack_1017 = 0xa2e65;
          pvVar34 = get_thread_log_callback_userdata();
          (*p_Var33)(pvVar34,Error,(char *)&ptr_id);
          pCVar41 = local_10a8;
        }
      }
      if (!bVar20) goto LAB_00161cf1;
    }
    pmVar31 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&resource_id);
    if (local_1094 == ~DESCRIPTOR_QA_TYPE_NONE_BIT) {
      _ptr_id = pCVar41;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      IVar22 = pmVar30->offset_buffer_id;
    }
    else {
      IVar22 = (impl->srv_index_to_offset).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[local_1094];
    }
    if (IVar22 == 0) {
      resource_id_1 = 0;
    }
    else {
      resource_id_1 =
           build_load_buffer_offset(impl,pRVar38,pmVar31,IVar22,resource_id_1,local_1098._0_1_);
    }
    pmVar32 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&loaded_id);
    CVar6 = pmVar31->component_type;
    uVar7 = *(undefined2 *)&pmVar31->field_0x2;
    RVar8 = pmVar31->raw_component_vecsize;
    uVar9 = pmVar31->stride;
    IVar22 = pmVar31->var_id;
    pmVar32->kind = pmVar31->kind;
    pmVar32->component_type = CVar6;
    *(undefined2 *)&pmVar32->field_0x2 = uVar7;
    pmVar32->raw_component_vecsize = RVar8;
    pmVar32->stride = uVar9;
    pmVar32->var_id = IVar22;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::operator=(&pmVar32->var_alias_group,&pmVar31->var_alias_group);
    bVar20 = pmVar31->non_uniform;
    bVar10 = pmVar31->counter_is_physical_pointer;
    bVar11 = pmVar31->rov;
    SVar25 = pmVar31->storage;
    IVar22 = pmVar31->counter_var_id;
    bVar12 = (pmVar31->physical_pointer_meta).nonwritable;
    bVar13 = (pmVar31->physical_pointer_meta).nonreadable;
    bVar14 = (pmVar31->physical_pointer_meta).coherent;
    bVar15 = (pmVar31->physical_pointer_meta).rov;
    uVar17 = (pmVar31->physical_pointer_meta).stride;
    uVar18 = *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5;
    uVar21 = (pmVar31->physical_pointer_meta).size;
    IVar23 = pmVar31->index_offset_id;
    IVar24 = (pmVar31->instrumentation).bda_id;
    pmVar32->aliased = pmVar31->aliased;
    pmVar32->non_uniform = bVar20;
    pmVar32->counter_is_physical_pointer = bVar10;
    pmVar32->rov = bVar11;
    pmVar32->storage = SVar25;
    pmVar32->counter_var_id = IVar22;
    (pmVar32->physical_pointer_meta).nonwritable = bVar12;
    (pmVar32->physical_pointer_meta).nonreadable = bVar13;
    (pmVar32->physical_pointer_meta).coherent = bVar14;
    (pmVar32->physical_pointer_meta).rov = bVar15;
    (pmVar32->physical_pointer_meta).stride = uVar17;
    *(undefined3 *)&(pmVar32->physical_pointer_meta).field_0x5 = uVar18;
    (pmVar32->physical_pointer_meta).size = uVar21;
    pmVar32->index_offset_id = IVar23;
    (pmVar32->instrumentation).bda_id = IVar24;
    IVar22 = (pmVar31->instrumentation).resource_size_id;
    (pmVar32->instrumentation).elem_size_id = (pmVar31->instrumentation).elem_size_id;
    (pmVar32->instrumentation).resource_size_id = IVar22;
    bVar20 = is_non_uniform;
    pmVar32->non_uniform = is_non_uniform;
    pmVar32->index_offset_id = resource_id_1;
    pRVar44 = (pmVar32->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (pmVar32->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pmVar32->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar32->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pRVar44 != (pointer)0x0) {
      free_in_thread(pRVar44);
    }
    pmVar32->aliased = pRVar38->aliased;
    (pmVar32->physical_pointer_meta).nonwritable = true;
    (pmVar32->instrumentation).resource_size_id = instrumentation.resource_size_id;
    (pmVar32->instrumentation).bda_id = instrumentation.bda_id;
    (pmVar32->instrumentation).elem_size_id = instrumentation.elem_size_id;
    if (pRVar38->bindless == true) {
      pmVar32->stride = pRVar38->stride;
    }
    if (bVar20 == false) goto LAB_00162044;
    IVar22 = spv::Builder::getDerefTypeId(pBVar27,resource_id);
    IVar22 = spv::Builder::getContainedTypeId(pBVar27,IVar22);
    if ((pBVar27->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_start[IVar22]->opCode != OpTypeAccelerationStructureKHR)
    {
      if (pmVar32->storage == StorageClassStorageBuffer) {
        _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bc);
      }
      else {
        DVar26 = spv::Builder::getTypeDimensionality(pBVar27,IVar22);
        if (DVar26 == DimBuffer) {
          _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bf);
        }
        else {
          _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bb);
        }
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar27->capabilities,&ptr_id);
    }
    break;
  case 1:
    if ((impl->ags).uav_magic_resource_type_index == resource_range) {
      if ((impl->ags).magic_ptr_id == 0) {
        uVar21 = SPIRVModule::allocate_id(impl->spirv_module);
        (impl->ags).magic_ptr_id = uVar21;
      }
      IVar22 = (impl->ags).magic_ptr_id;
      goto LAB_00160c0f;
    }
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pCVar41 = (CallInst *)&pmVar30->reference;
    }
    else {
      pCVar41 = (CallInst *)
                ((impl->uav_index_to_reference).
                 super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                 ._M_impl.super__Vector_impl_data._M_start + resource_range);
    }
    lVar42 = (long)*(int *)&(pCVar41->super_Instruction).attachments._M_h._M_buckets;
    if (lVar42 < 0) {
      cVar46 = *(char *)((long)&(pCVar41->super_Instruction).operands.
                                super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
    }
    else {
      cVar46 = (impl->local_root_signature).
               super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar42].type == Descriptor;
    }
    if (cVar46 != '\0') {
      IVar22 = build_root_descriptor_load_physical_pointer(impl,(ResourceReference *)pCVar41);
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar22);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar22);
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      pmVar31->kind = Invalid;
      pmVar31->component_type = Invalid;
      pmVar31->raw_component_vecsize = V1;
      pmVar31->stride = 0;
      pmVar31->var_id = 0;
      pRVar44 = (pmVar31->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar44 != (pointer)0x0) {
        free_in_thread(pRVar44);
      }
      pmVar31->aliased = false;
      pmVar31->non_uniform = false;
      pmVar31->counter_is_physical_pointer = false;
      pmVar31->rov = false;
      pmVar31->storage = StorageClassUniformConstant;
      pmVar31->counter_var_id = 0;
      (pmVar31->physical_pointer_meta).nonwritable = false;
      (pmVar31->physical_pointer_meta).nonreadable = false;
      (pmVar31->physical_pointer_meta).coherent = false;
      (pmVar31->physical_pointer_meta).rov = false;
      (pmVar31->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar31->physical_pointer_meta).size = 0;
      (pmVar31->instrumentation).bda_id = 0;
      (pmVar31->instrumentation).elem_size_id = 0;
      (pmVar31->instrumentation).resource_size_id = 0;
      pmVar31->stride =
           *(uint *)((long)&(pCVar41->super_Instruction).operands.
                            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4);
      pmVar31->storage = StorageClassPhysicalStorageBuffer;
      (pmVar31->physical_pointer_meta).coherent =
           *(bool *)((long)&(pCVar41->super_Instruction).operands.
                            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      bVar20 = *(bool *)((long)&(pCVar41->super_Instruction).operands.
                                super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      (pmVar31->physical_pointer_meta).rov = bVar20;
      pmVar31->kind =
           *(ResourceKind *)
            ((long)&(pCVar41->super_Instruction).operands.
                    super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
      pmVar31->rov = bVar20;
      return true;
    }
    is_non_uniform_3 = false;
    IVar22 = *(Id *)&(pCVar41->super_Instruction).super_Value.type;
    if (IVar22 == 0) {
      uVar2 = *(uint64_t *)&(pCVar41->super_Instruction).super_Value.kind;
      if (uVar2 == (pCVar41->super_Instruction).super_Value.tween_id) {
        IVar22 = 0;
      }
      else {
        IVar22 = *(Id *)(uVar2 + 0xc);
      }
    }
    SVar25 = get_resource_storage_class(impl,IVar22);
    DVar5 = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
    if (SVar25 != StorageClassStorageBuffer) {
      DVar5 = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;
      if ((byte)(*(char *)((long)&(pCVar41->super_Instruction).operands.
                                  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) - 10U) < 4
         ) {
        DVar5 = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
      }
    }
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    resource_id = 0;
    _is_non_uniform = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve(&raw_declarations,
              (long)((pCVar41->super_Instruction).super_Value.tween_id -
                    *(long *)&(pCVar41->super_Instruction).super_Value.kind) >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar22 = *(Id *)&(pCVar41->super_Instruction).super_Value.type;
    local_10a0 = pCVar41;
    if ((IVar22 == 0) ||
       (resource_id = IVar22,
       bVar20 = build_load_resource_handle
                          (impl,IVar22,(ResourceReference *)pCVar41,DVar5,local_10a8,
                           instruction_offset,non_uniform,&is_non_uniform_3,(Id *)&is_non_uniform,
                           &loaded_id,&resource_id_1,&instrumentation), bVar20)) {
      pcVar4 = (char *)(pCVar41->super_Instruction).super_Value.tween_id;
      pcVar45 = *(char **)&(pCVar41->super_Instruction).super_Value.kind;
      local_1098 = uVar43;
      pCVar41 = local_10a8;
      for (; pcVar45 != pcVar4; pcVar45 = pcVar45 + 0x10) {
        resource_id = *(Id *)(pcVar45 + 0xc);
        bVar20 = build_load_resource_handle
                           (impl,resource_id,(ResourceReference *)local_10a0,DVar5,pCVar41,
                            instruction_offset,non_uniform,&is_non_uniform_3,(Id *)0x0,&loaded_id,
                            &resource_id_1,&instrumentation);
        if (bVar20) {
          _ptr_id = *(CallInst **)pcVar45;
          uStack_1030._4_4_ = loaded_id;
          uStack_1030._0_4_ = *(RawVecSize *)(pcVar45 + 8);
          if (raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                      (&raw_declarations,
                       (iterator)
                       raw_declarations.
                       super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(RawDeclarationVariable *)&ptr_id)
            ;
          }
          else {
            *(CallInst **)
             &(raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish)->declaration = _ptr_id;
            *(undefined8 *)
             &((raw_declarations.
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_finish)->declaration).vecsize = uStack_1030;
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 raw_declarations.
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          p_Var33 = get_thread_log_callback();
          if (p_Var33 == (LoggingCallback)0x0) {
            emit_create_handle();
            pCVar41 = local_10a8;
          }
          else {
            builtin_strncpy(acStack_1028,"AV resour",9);
            local_101f = 0x68206563;
            _ptr_id = (CallInst *)0x742064656c696146;
            uStack_1030 = 0x552064616f6c206f;
            uStack_101b = 0x6c646e61;
            uStack_1017 = 0xa2e65;
            pvVar34 = get_thread_log_callback_userdata();
            (*p_Var33)(pvVar34,Error,(char *)&ptr_id);
            pCVar41 = local_10a8;
          }
        }
        if (!bVar20) goto LAB_00161cf1;
      }
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&resource_id);
      if (local_1094 == ~DESCRIPTOR_QA_TYPE_NONE_BIT) {
        _ptr_id = pCVar41;
        pmVar30 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
        IVar22 = pmVar30->offset_buffer_id;
      }
      else {
        IVar22 = (impl->uav_index_to_offset).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_1094];
      }
      if (IVar22 == 0) {
        resource_id_1 = 0;
      }
      else {
        resource_id_1 =
             build_load_buffer_offset
                       (impl,(ResourceReference *)local_10a0,pmVar31,IVar22,resource_id_1,
                        local_1098._0_1_);
      }
      pmVar32 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&loaded_id);
      CVar6 = pmVar31->component_type;
      uVar7 = *(undefined2 *)&pmVar31->field_0x2;
      RVar8 = pmVar31->raw_component_vecsize;
      uVar9 = pmVar31->stride;
      IVar22 = pmVar31->var_id;
      pmVar32->kind = pmVar31->kind;
      pmVar32->component_type = CVar6;
      *(undefined2 *)&pmVar32->field_0x2 = uVar7;
      pmVar32->raw_component_vecsize = RVar8;
      pmVar32->stride = uVar9;
      pmVar32->var_id = IVar22;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::operator=(&pmVar32->var_alias_group,&pmVar31->var_alias_group);
      bVar16 = is_non_uniform_3;
      bVar20 = pmVar31->non_uniform;
      bVar10 = pmVar31->counter_is_physical_pointer;
      bVar11 = pmVar31->rov;
      SVar25 = pmVar31->storage;
      IVar22 = pmVar31->counter_var_id;
      bVar12 = (pmVar31->physical_pointer_meta).nonwritable;
      bVar13 = (pmVar31->physical_pointer_meta).nonreadable;
      bVar14 = (pmVar31->physical_pointer_meta).coherent;
      bVar15 = (pmVar31->physical_pointer_meta).rov;
      uVar17 = (pmVar31->physical_pointer_meta).stride;
      uVar18 = *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5;
      uVar21 = (pmVar31->physical_pointer_meta).size;
      IVar23 = pmVar31->index_offset_id;
      IVar24 = (pmVar31->instrumentation).bda_id;
      pmVar32->aliased = pmVar31->aliased;
      pmVar32->non_uniform = bVar20;
      pmVar32->counter_is_physical_pointer = bVar10;
      pmVar32->rov = bVar11;
      pmVar32->storage = SVar25;
      pmVar32->counter_var_id = IVar22;
      (pmVar32->physical_pointer_meta).nonwritable = bVar12;
      (pmVar32->physical_pointer_meta).nonreadable = bVar13;
      (pmVar32->physical_pointer_meta).coherent = bVar14;
      (pmVar32->physical_pointer_meta).rov = bVar15;
      (pmVar32->physical_pointer_meta).stride = uVar17;
      *(undefined3 *)&(pmVar32->physical_pointer_meta).field_0x5 = uVar18;
      (pmVar32->physical_pointer_meta).size = uVar21;
      pmVar32->index_offset_id = IVar23;
      (pmVar32->instrumentation).bda_id = IVar24;
      IVar22 = (pmVar31->instrumentation).resource_size_id;
      (pmVar32->instrumentation).elem_size_id = (pmVar31->instrumentation).elem_size_id;
      (pmVar32->instrumentation).resource_size_id = IVar22;
      pmVar32->non_uniform = is_non_uniform_3;
      pmVar32->index_offset_id = resource_id_1;
      pRVar44 = (pmVar32->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar32->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start =
           raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pmVar32->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pmVar32->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pRVar44 != (pointer)0x0) {
        free_in_thread(pRVar44);
      }
      pCVar41 = local_10a8;
      pmVar32->aliased =
           *(bool *)&(local_10a0->super_Instruction).operands.
                     super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pmVar32->rov = *(bool *)((long)&(local_10a0->super_Instruction).operands.
                                      super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
      (pmVar32->physical_pointer_meta).coherent =
           *(bool *)((long)&(local_10a0->super_Instruction).operands.
                            super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
      (pmVar32->instrumentation).bda_id = instrumentation.bda_id;
      (pmVar32->instrumentation).elem_size_id = instrumentation.elem_size_id;
      (pmVar32->instrumentation).resource_size_id = instrumentation.resource_size_id;
      pmVar32->var_id = _is_non_uniform;
      if (*(bool *)&(local_10a0->super_Instruction).operands.
                    super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == true) {
        pmVar32->stride =
             *(uint *)((long)&(local_10a0->super_Instruction).operands.
                              super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish + 4);
      }
      pCVar40 = local_10a0;
      if (bVar16 != false) {
        IVar22 = spv::Builder::getDerefTypeId(pBVar27,resource_id);
        IVar22 = spv::Builder::getContainedTypeId(pBVar27,IVar22);
        if (pmVar32->storage == StorageClassStorageBuffer) {
          _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bc);
        }
        else {
          DVar26 = spv::Builder::getTypeDimensionality(pBVar27,IVar22);
          if (DVar26 == DimBuffer) {
            _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14c0);
          }
          else {
            _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bd);
          }
        }
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar27->capabilities,&ptr_id);
        spv::Builder::addExtension(pBVar27,"SPV_EXT_descriptor_indexing");
      }
      uVar43 = local_1098;
      _ptr_id = pCVar41;
      sVar37 = std::
               _Hashtable<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(impl->llvm_values_using_update_counter)._M_h,(key_type *)&ptr_id);
      if (sVar37 == 0) goto LAB_00162044;
      if (local_1094 == ~DESCRIPTOR_QA_TYPE_NONE_BIT) {
        _ptr_id = pCVar41;
        pmVar30 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
        pRVar38 = &pmVar30->counter_reference;
      }
      else {
        pRVar38 = (impl->uav_index_to_counter).
                  super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_1094;
      }
      if (pRVar38->bindless == true) {
        if (pRVar38->resource_kind == RawBuffer) {
          IVar22 = build_load_physical_pointer(impl,pRVar38,instruction_offset,pCVar40);
          pmVar32->counter_var_id = IVar22;
          pmVar32->counter_is_physical_pointer = true;
          (pmVar32->instrumentation).bda_id = 0;
          (pmVar32->instrumentation).elem_size_id = 0;
          (pmVar32->instrumentation).resource_size_id = 0;
          goto LAB_00162044;
        }
        bVar20 = build_load_resource_handle
                           (impl,pRVar38->var_id,(ResourceReference *)local_10a0,
                            DESCRIPTOR_QA_TYPE_RAW_VA_BIT,pCVar41,instruction_offset,SUB41(uVar43,0)
                            ,&is_non_uniform_3,&pmVar32->counter_var_id,(Id *)0x0,(Id *)0x0,
                            (ResourceMetaInstrumentation *)0x0);
        if (!bVar20) {
          p_Var33 = get_thread_log_callback();
          if (p_Var33 == (LoggingCallback)0x0) {
            emit_create_handle();
            goto LAB_00161cf1;
          }
          acStack_1028[0] = 'A';
          acStack_1028[1] = 'V';
          acStack_1028[2] = ' ';
          acStack_1028[3] = 'c';
          acStack_1028[4] = 'o';
          acStack_1028[5] = 'u';
          acStack_1028[6] = 'n';
          acStack_1028[7] = 't';
          acStack_1028[8] = 0x65;
          local_101f = 0x6f702072;
          uStack_1030 = 0x552064616f6c206f;
          uVar36 = 0xa2e7265746e69;
          goto LAB_00161cdb;
        }
      }
      else {
        pmVar32->counter_var_id = pRVar38->var_id;
      }
      pmVar32->counter_is_physical_pointer = false;
      goto LAB_00162044;
    }
    p_Var33 = get_thread_log_callback();
    if (p_Var33 != (LoggingCallback)0x0) {
      builtin_strncpy(acStack_1028,"AV resou",8);
      uStack_1030._4_1_ = 'a';
      uStack_1030._5_1_ = 'd';
      uStack_1030._6_1_ = ' ';
      uStack_1030._7_1_ = 'U';
      goto LAB_00161ccd;
    }
    emit_create_handle();
LAB_00161cf1:
    if (raw_declarations.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(raw_declarations.
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
LAB_00162055:
    return false;
  case 2:
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar30->reference;
    }
    else {
      pRVar38 = (impl->cbv_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    lVar42 = (long)pRVar38->local_root_signature_entry;
    pLVar28 = (pointer)0x0;
    if (lVar42 < 0) {
      cVar46 = pRVar38->root_descriptor;
    }
    else {
      cVar46 = (impl->local_root_signature).
               super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar42].type == Descriptor;
      pLVar28 = (impl->local_root_signature).
                super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar42;
    }
    if (cVar46 != '\0') {
      IVar22 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar22);
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      pmVar31->kind = Invalid;
      pmVar31->component_type = Invalid;
      pmVar31->raw_component_vecsize = V1;
      pmVar31->stride = 0;
      pmVar31->var_id = 0;
      pRVar44 = (pmVar31->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar44 != (pointer)0x0) {
        free_in_thread(pRVar44);
      }
      pmVar31->aliased = false;
      pmVar31->non_uniform = false;
      pmVar31->counter_is_physical_pointer = false;
      pmVar31->rov = false;
      pmVar31->storage = StorageClassUniformConstant;
      pmVar31->counter_var_id = 0;
      (pmVar31->physical_pointer_meta).nonwritable = false;
      (pmVar31->physical_pointer_meta).nonreadable = false;
      (pmVar31->physical_pointer_meta).coherent = false;
      (pmVar31->physical_pointer_meta).rov = false;
      (pmVar31->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar31->physical_pointer_meta).size = 0;
      (pmVar31->instrumentation).bda_id = 0;
      (pmVar31->instrumentation).elem_size_id = 0;
      (pmVar31->instrumentation).resource_size_id = 0;
      pmVar31->stride = pRVar38->stride;
      pmVar31->storage = StorageClassPhysicalStorageBuffer;
      (pmVar31->physical_pointer_meta).nonwritable = true;
      pmVar31->kind = pRVar38->resource_kind;
      IVar22 = ptr_id;
LAB_00160c0f:
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar22);
      return true;
    }
    IVar22 = pRVar38->var_id;
    if ((IVar22 != 0) && (IVar22 == impl->root_constant_id)) {
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar22);
      mVar1 = pRVar38->push_constant_member;
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_root_member_offset,(key_type *)&ptr_id);
      *pmVar29 = mVar1;
      return true;
    }
    if ((pLVar28 != (pointer)0x0) && (pLVar28->type == Constants)) {
      IVar22 = build_shader_record_access_chain(impl,pRVar38->local_root_signature_entry);
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(raw_declarations.
                             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar22);
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,(key_type *)&raw_declarations);
      pmVar31->kind = Invalid;
      pmVar31->component_type = Invalid;
      pmVar31->raw_component_vecsize = V1;
      pmVar31->stride = 0;
      pmVar31->var_id = 0;
      pRVar44 = (pmVar31->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar44 != (pointer)0x0) {
        free_in_thread(pRVar44);
      }
      pmVar31->aliased = false;
      pmVar31->non_uniform = false;
      pmVar31->counter_is_physical_pointer = false;
      pmVar31->rov = false;
      pmVar31->storage = StorageClassUniformConstant;
      pmVar31->counter_var_id = 0;
      (pmVar31->physical_pointer_meta).nonwritable = false;
      (pmVar31->physical_pointer_meta).nonreadable = false;
      (pmVar31->physical_pointer_meta).coherent = false;
      (pmVar31->physical_pointer_meta).rov = false;
      (pmVar31->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar31->physical_pointer_meta).size = 0;
      (pmVar31->instrumentation).bda_id = 0;
      (pmVar31->instrumentation).elem_size_id = 0;
      (pmVar31->instrumentation).resource_size_id = 0;
      pmVar31->storage = StorageClassShaderRecordBufferKHR;
      pmVar31->kind = CBuffer;
      mVar1 = pRVar38->local_root_signature_entry;
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_root_member_offset,(key_type *)&ptr_id);
      *pmVar29 = mVar1;
      IVar22 = (Id)raw_declarations.
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_00160c0f;
    }
    resource_id = resource_id & 0xffffff00;
    local_108d = (impl->options).bindless_cbv_ssbo_emulation & pRVar38->bindless;
    SVar25 = StorageClassUniform;
    if (local_108d != 0) {
      SVar25 = StorageClassStorageBuffer;
    }
    local_1094 = (uint)local_108d * 4 + DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve(&raw_declarations,
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar22 = pRVar38->var_id;
    if ((IVar22 != 0) &&
       (resource_id_1 = IVar22,
       bVar20 = build_load_resource_handle
                          (impl,IVar22,pRVar38,local_1094,local_10a8,instruction_offset,non_uniform,
                           (bool *)&resource_id,(Id *)0x0,&loaded_id,(Id *)0x0,&instrumentation),
       !bVar20)) {
      p_Var33 = get_thread_log_callback();
      if (p_Var33 != (LoggingCallback)0x0) {
        builtin_strncpy(acStack_1028,"BV resou",8);
        uStack_1030._4_1_ = 'a';
        uStack_1030._5_1_ = 'd';
        uStack_1030._6_1_ = ' ';
        uStack_1030._7_1_ = 'C';
        goto LAB_00161ccd;
      }
      emit_create_handle();
      goto LAB_00161cf1;
    }
    DVar5 = local_1094;
    pCVar41 = (CallInst *)
              (pRVar38->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_10a0 = (CallInst *)
                 (pRVar38->var_alias_group).
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pCVar40 = local_10a8;
    if (pCVar41 != local_10a0) {
      do {
        resource_id_1 = *(Id *)&(pCVar41->super_Instruction).super_Value.field_0xc;
        bVar20 = build_load_resource_handle
                           (impl,resource_id_1,pRVar38,DVar5,pCVar40,instruction_offset,non_uniform,
                            (bool *)&resource_id,(Id *)0x0,&loaded_id,(Id *)0x0,&instrumentation);
        if (bVar20) {
          _ptr_id = (CallInst *)(pCVar41->super_Instruction).super_Value.type;
          uStack_1030._4_4_ = loaded_id;
          uStack_1030._0_4_ =
               *(RawVecSize *)
                &(((Vector<RawDeclarationVariable> *)&(pCVar41->super_Instruction).super_Value.kind)
                 ->
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 )._M_impl.super__Vector_impl_data._M_start;
          if (raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                      (&raw_declarations,
                       (iterator)
                       raw_declarations.
                       super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(RawDeclarationVariable *)&ptr_id)
            ;
          }
          else {
            *(CallInst **)
             &(raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish)->declaration = _ptr_id;
            *(undefined8 *)
             &((raw_declarations.
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_finish)->declaration).vecsize = uStack_1030;
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 raw_declarations.
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          p_Var33 = get_thread_log_callback();
          if (p_Var33 == (LoggingCallback)0x0) {
            emit_create_handle();
            pCVar40 = local_10a8;
          }
          else {
            builtin_strncpy(acStack_1028,"BV resour",9);
            local_101f = 0x68206563;
            _ptr_id = (CallInst *)0x742064656c696146;
            uStack_1030 = 0x432064616f6c206f;
            uStack_101b = 0x6c646e61;
            uStack_1017 = 0xa2e65;
            pvVar34 = get_thread_log_callback_userdata();
            (*p_Var33)(pvVar34,Error,(char *)&ptr_id);
            pCVar40 = local_10a8;
          }
        }
        if (!bVar20) goto LAB_00161cf1;
        pCVar41 = (CallInst *)&(pCVar41->super_Instruction).super_Value.tween_id;
      } while (pCVar41 != local_10a0);
    }
    pmVar31 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&resource_id_1);
    pmVar32 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&loaded_id);
    CVar6 = pmVar31->component_type;
    uVar7 = *(undefined2 *)&pmVar31->field_0x2;
    RVar8 = pmVar31->raw_component_vecsize;
    uVar9 = pmVar31->stride;
    IVar22 = pmVar31->var_id;
    pmVar32->kind = pmVar31->kind;
    pmVar32->component_type = CVar6;
    *(undefined2 *)&pmVar32->field_0x2 = uVar7;
    pmVar32->raw_component_vecsize = RVar8;
    pmVar32->stride = uVar9;
    pmVar32->var_id = IVar22;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::operator=(&pmVar32->var_alias_group,&pmVar31->var_alias_group);
    bVar20 = pmVar31->non_uniform;
    bVar10 = pmVar31->counter_is_physical_pointer;
    bVar11 = pmVar31->rov;
    SVar19 = pmVar31->storage;
    IVar22 = pmVar31->counter_var_id;
    bVar12 = (pmVar31->physical_pointer_meta).nonwritable;
    bVar13 = (pmVar31->physical_pointer_meta).nonreadable;
    bVar14 = (pmVar31->physical_pointer_meta).coherent;
    bVar15 = (pmVar31->physical_pointer_meta).rov;
    uVar17 = (pmVar31->physical_pointer_meta).stride;
    uVar18 = *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5;
    uVar21 = (pmVar31->physical_pointer_meta).size;
    IVar23 = pmVar31->index_offset_id;
    IVar24 = (pmVar31->instrumentation).bda_id;
    pmVar32->aliased = pmVar31->aliased;
    pmVar32->non_uniform = bVar20;
    pmVar32->counter_is_physical_pointer = bVar10;
    pmVar32->rov = bVar11;
    pmVar32->storage = SVar19;
    pmVar32->counter_var_id = IVar22;
    (pmVar32->physical_pointer_meta).nonwritable = bVar12;
    (pmVar32->physical_pointer_meta).nonreadable = bVar13;
    (pmVar32->physical_pointer_meta).coherent = bVar14;
    (pmVar32->physical_pointer_meta).rov = bVar15;
    (pmVar32->physical_pointer_meta).stride = uVar17;
    *(undefined3 *)&(pmVar32->physical_pointer_meta).field_0x5 = uVar18;
    (pmVar32->physical_pointer_meta).size = uVar21;
    pmVar32->index_offset_id = IVar23;
    (pmVar32->instrumentation).bda_id = IVar24;
    IVar22 = (pmVar31->instrumentation).resource_size_id;
    (pmVar32->instrumentation).elem_size_id = (pmVar31->instrumentation).elem_size_id;
    (pmVar32->instrumentation).resource_size_id = IVar22;
    bVar20 = resource_id._0_1_;
    pmVar32->non_uniform = resource_id._0_1_;
    pmVar32->storage = SVar25;
    pRVar44 = (pmVar32->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (pmVar32->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pmVar32->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar32->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pRVar44 != (pointer)0x0) {
      free_in_thread(pRVar44);
    }
    pmVar32->kind = CBuffer;
    (pmVar32->instrumentation).bda_id = instrumentation.bda_id;
    (pmVar32->instrumentation).elem_size_id = instrumentation.elem_size_id;
    (pmVar32->instrumentation).resource_size_id = instrumentation.resource_size_id;
    if (bVar20 == false) goto LAB_00162044;
    if (local_108d == 0) {
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14ba);
    }
    else {
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bc);
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar27->capabilities,&ptr_id);
    break;
  case 3:
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar30 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar30->reference;
    }
    else {
      pRVar38 = (impl->sampler_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(raw_declarations.
                           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,pRVar38->var_id);
    loaded_id = loaded_id & 0xffffff00;
    instrumentation._0_8_ = (ulong)instrumentation.elem_size_id << 0x20;
    bVar20 = build_load_resource_handle
                       (impl,pRVar38->var_id,pRVar38,DESCRIPTOR_QA_TYPE_SAMPLER_BIT,instruction,
                        instruction_offset,non_uniform,(bool *)&loaded_id,(Id *)0x0,
                        &instrumentation.bda_id,(Id *)0x0,(ResourceMetaInstrumentation *)0x0);
    if (bVar20) {
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&instrumentation.bda_id);
      pmVar32 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,(key_type *)&raw_declarations);
      CVar6 = pmVar32->component_type;
      uVar7 = *(undefined2 *)&pmVar32->field_0x2;
      RVar8 = pmVar32->raw_component_vecsize;
      uVar9 = pmVar32->stride;
      IVar22 = pmVar32->var_id;
      pmVar31->kind = pmVar32->kind;
      pmVar31->component_type = CVar6;
      *(undefined2 *)&pmVar31->field_0x2 = uVar7;
      pmVar31->raw_component_vecsize = RVar8;
      pmVar31->stride = uVar9;
      pmVar31->var_id = IVar22;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::operator=(&pmVar31->var_alias_group,&pmVar32->var_alias_group);
      bVar10 = pmVar32->non_uniform;
      bVar11 = pmVar32->counter_is_physical_pointer;
      bVar12 = pmVar32->rov;
      SVar25 = pmVar32->storage;
      IVar22 = pmVar32->counter_var_id;
      bVar13 = (pmVar32->physical_pointer_meta).nonwritable;
      bVar14 = (pmVar32->physical_pointer_meta).nonreadable;
      bVar15 = (pmVar32->physical_pointer_meta).coherent;
      bVar16 = (pmVar32->physical_pointer_meta).rov;
      uVar17 = (pmVar32->physical_pointer_meta).stride;
      uVar18 = *(undefined3 *)&(pmVar32->physical_pointer_meta).field_0x5;
      uVar21 = (pmVar32->physical_pointer_meta).size;
      IVar23 = pmVar32->index_offset_id;
      IVar24 = (pmVar32->instrumentation).bda_id;
      pmVar31->aliased = pmVar32->aliased;
      pmVar31->non_uniform = bVar10;
      pmVar31->counter_is_physical_pointer = bVar11;
      pmVar31->rov = bVar12;
      pmVar31->storage = SVar25;
      pmVar31->counter_var_id = IVar22;
      (pmVar31->physical_pointer_meta).nonwritable = bVar13;
      (pmVar31->physical_pointer_meta).nonreadable = bVar14;
      (pmVar31->physical_pointer_meta).coherent = bVar15;
      (pmVar31->physical_pointer_meta).rov = bVar16;
      (pmVar31->physical_pointer_meta).stride = uVar17;
      *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5 = uVar18;
      (pmVar31->physical_pointer_meta).size = uVar21;
      pmVar31->index_offset_id = IVar23;
      (pmVar31->instrumentation).bda_id = IVar24;
      IVar22 = (pmVar32->instrumentation).resource_size_id;
      (pmVar31->instrumentation).elem_size_id = (pmVar32->instrumentation).elem_size_id;
      (pmVar31->instrumentation).resource_size_id = IVar22;
      pmVar31->non_uniform = loaded_id._0_1_;
      if (loaded_id._0_1_ == true) {
        _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bb);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar27->capabilities,&ptr_id);
        spv::Builder::addExtension(pBVar27,"SPV_EXT_descriptor_indexing");
      }
    }
    else {
      p_Var33 = get_thread_log_callback();
      if (p_Var33 == (LoggingCallback)0x0) {
        emit_create_handle();
      }
      else {
        uStack_1017 = 0x6c646e61;
        uStack_1013 = 0xa2e65;
        builtin_strncpy(acStack_1028,"ampler re",9);
        local_101f = 0x72756f73;
        uStack_101b = 0x68206563;
        _ptr_id = (CallInst *)0x742064656c696146;
        uStack_1030 = 0x532064616f6c206f;
        pvVar34 = get_thread_log_callback_userdata();
        (*p_Var33)(pvVar34,Error,(char *)&ptr_id);
      }
    }
    if (bVar20) {
      return true;
    }
    return false;
  default:
    goto LAB_00162055;
  }
  spv::Builder::addExtension(pBVar27,"SPV_EXT_descriptor_indexing");
LAB_00162044:
  if (raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free_in_thread(raw_declarations.
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

static bool emit_create_handle(Converter::Impl &impl, const llvm::CallInst *instruction,
                               DXIL::ResourceType resource_type, unsigned resource_range,
                               llvm::Value *instruction_offset, bool non_uniform)
{
	auto &builder = impl.builder();
	switch (resource_type)
	{
	case DXIL::ResourceType::SRV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_rtas(impl, reference))
		{
			spv::Id ptr_id = build_load_physical_rtas(impl, reference, instruction_offset, non_uniform);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.storage = spv::StorageClassGeneric;
			meta.kind = DXIL::ResourceKind::RTAccelerationStructure;
		}
		else if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
			else if (reference.resource_kind == DXIL::ResourceKind::RTAccelerationStructure)
				descriptor_type = DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.physical_pointer_meta.nonwritable = true;
			meta.instrumentation = instrumentation;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (builder.getTypeClass(type_id) != spv::OpTypeAccelerationStructureKHR)
				{
					if (meta.storage == spv::StorageClassStorageBuffer)
						builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
					else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
						builder.addCapability(spv::CapabilityUniformTexelBufferArrayNonUniformIndexing);
					else
						builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
				}
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::UAV:
	{
		if (resource_range == impl.ags.uav_magic_resource_type_index)
		{
			// Resources tied to constant uints are considered "magic".
			if (impl.ags.magic_ptr_id == 0)
			{
				spv::Id dummy_value = impl.spirv_module.allocate_id();
				impl.ags.magic_ptr_id = dummy_value;
			}

			impl.rewrite_value(instruction, impl.ags.magic_ptr_id);
			break;
		}

		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.physical_pointer_meta.rov = reference.rov;
			meta.kind = reference.resource_kind;
			meta.rov = reference.rov;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			spv::Id resource_ptr_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
				                                instruction_offset, non_uniform, is_non_uniform, &resource_ptr_id,
				                                &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.rov = reference.rov;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.instrumentation = instrumentation;

			// Image atomics requires the pointer to image and not OpTypeImage directly.
			meta.var_id = resource_ptr_id;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (meta.storage == spv::StorageClassStorageBuffer)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
				else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
					builder.addCapability(spv::CapabilityStorageTexelBufferArrayNonUniformIndexing);
				else
					builder.addCapability(spv::CapabilityStorageImageArrayNonUniformIndexing);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}

			if (impl.llvm_values_using_update_counter.count(instruction) != 0)
			{
				auto &counter_reference = get_resource_counter_reference(impl, instruction, resource_range);

				if (counter_reference.bindless)
				{
					if (counter_reference.resource_kind == DXIL::ResourceKind::RawBuffer)
					{
						meta.counter_var_id = build_load_physical_pointer(impl, counter_reference, instruction_offset, instruction);
						meta.counter_is_physical_pointer = true;
						// Don't support this since the physical pointer we get from heap is actually the counter.
						meta.instrumentation = {};
					}
					else
					{
						if (!build_load_resource_handle(impl, counter_reference.var_id, reference,
						                                DESCRIPTOR_QA_TYPE_RAW_VA_BIT,
						                                instruction, instruction_offset, non_uniform,
						                                is_non_uniform, &meta.counter_var_id, nullptr, nullptr, nullptr))
						{
							LOGE("Failed to load UAV counter pointer.\n");
							return false;
						}
						meta.counter_is_physical_pointer = false;
					}
				}
				else
				{
					meta.counter_var_id = counter_reference.var_id;
					meta.counter_is_physical_pointer = false;
				}
			}
		}
		break;
	}

	case DXIL::ResourceType::CBV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		const LocalRootSignatureEntry *local_root_signature_entry = nullptr;
		if (reference.local_root_signature_entry >= 0)
			local_root_signature_entry = &impl.local_root_signature[reference.local_root_signature_entry];

		// Special case root constants since these resources point directly to
		// the push constant block or SBT and not to any concrete resource,
		// so we cannot deduce storage classes properly.

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
			impl.rewrite_value(instruction, ptr_id);
		}
		else if (reference.var_id != 0 && reference.var_id == impl.root_constant_id)
		{
			// Point directly to root constants.
			impl.rewrite_value(instruction, reference.var_id);
			unsigned member_offset = reference.push_constant_member;
			impl.handle_to_root_member_offset[instruction] = member_offset;
		}
		else if (local_root_signature_entry && local_root_signature_entry->type == LocalRootSignatureType::Constants)
		{
			// Access chain into the desired member once.
			spv::Id id = build_shader_record_access_chain(impl, reference.local_root_signature_entry);

			auto &meta = impl.handle_to_resource_meta[id];
			meta = {};
			meta.storage = spv::StorageClassShaderRecordBufferKHR;
			meta.kind = DXIL::ResourceKind::CBuffer;
			impl.handle_to_root_member_offset[instruction] = reference.local_root_signature_entry;
			impl.rewrite_value(instruction, id);
		}
		else
		{
			bool is_non_uniform = false;

			bool ssbo = reference.bindless && impl.options.bindless_cbv_ssbo_emulation;
			auto storage = ssbo ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;
			auto descriptor_type = ssbo ? DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT : DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.storage = storage;
			meta.var_alias_group = std::move(raw_declarations);
			meta.kind = DXIL::ResourceKind::CBuffer;
			meta.instrumentation = instrumentation;

			if (is_non_uniform)
			{
				if (ssbo)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexingEXT);
				else
					builder.addCapability(spv::CapabilityUniformBufferArrayNonUniformIndexingEXT);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::Sampler:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		spv::Id base_sampler_id = reference.var_id;

		bool is_non_uniform = false;
		spv::Id loaded_id = 0;
		if (!build_load_resource_handle(impl, base_sampler_id, reference, DESCRIPTOR_QA_TYPE_SAMPLER_BIT, instruction,
		                                instruction_offset, non_uniform, is_non_uniform, nullptr, &loaded_id, nullptr, nullptr))
		{
			LOGE("Failed to load Sampler resource handle.\n");
			return false;
		}

		auto &meta = impl.handle_to_resource_meta[loaded_id];
		meta = impl.handle_to_resource_meta[base_sampler_id];
		meta.non_uniform = is_non_uniform;

		if (is_non_uniform)
		{
			builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
			builder.addExtension("SPV_EXT_descriptor_indexing");
		}
		break;
	}

	default:
		return false;
	}

	return true;
}